

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

void __thiscall CVmRun::check_prop_spec_eval(CVmRun *this,vm_obj_id_t obj,vm_prop_id_t prop)

{
  int iVar1;
  undefined6 in_register_00000012;
  vm_obj_id_t srcobj;
  vm_val_t val;
  undefined1 local_14 [4];
  uint local_10 [4];
  
  iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[obj >> 0xc][obj & 0xfff].ptr_ + 0x68))
                    (G_obj_table_X.pages_[obj >> 0xc] + (obj & 0xfff),
                     CONCAT62(in_register_00000012,prop) & 0xffffffff,local_10,obj,local_14,0);
  if (((iVar1 != 0) && (local_10[0] < 0x13)) && ((0x64a00U >> (local_10[0] & 0x1f) & 1) != 0)) {
    err_throw(0x9c5);
  }
  return;
}

Assistant:

void CVmRun::check_prop_spec_eval(VMG_ vm_obj_id_t obj, vm_prop_id_t prop)
{
    vm_val_t val;
    vm_obj_id_t srcobj;

    /* get the property value */
    if (vm_objp(vmg_ obj)->get_prop(vmg_ prop, &val, obj, &srcobj, 0))
    {
        /* check the type of the value */
        switch(val.typ)
        {
        case VM_CODEOFS:
        case VM_OBJX:
        case VM_BIFPTRX:
        case VM_DSTRING:
        case VM_NATIVE_CODE:
            /* 
             *   evaulating these types could result in side effects, so
             *   this property cannot be evaulated during a speculative
             *   evaluation 
             */
            err_throw(VMERR_BAD_SPEC_EVAL);
            break;

        default:
            /* evaluating other types causes no side effects, so proceed */
            break;
        }
    }
}